

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cc
# Opt level: O0

void __thiscall PoolTest_Pooled_Test::TestBody(PoolTest_Pooled_Test *this)

{
  bool bVar1;
  CRYPTO_BUFFER_POOL *__p;
  char *pcVar2;
  pointer pcVar3;
  CRYPTO_BUFFER *pCVar4;
  pointer pcVar5;
  uint8_t *puVar6;
  size_t sVar7;
  Message *message;
  char *in_R9;
  AssertHelper local_508;
  Message local_500;
  pointer local_4f8;
  pointer local_4f0;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_14;
  UniquePtr<CRYPTO_BUFFER> buf7;
  Message local_4c8;
  pointer local_4c0;
  pointer local_4b8;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_13;
  Message local_498;
  size_t local_490;
  unsigned_long local_488;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_12;
  Message local_468;
  uint8_t *local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_428;
  Message local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar__5;
  UniquePtr<CRYPTO_BUFFER> buf6;
  Message local_3f8;
  pointer local_3f0;
  pointer local_3e8;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_10;
  UniquePtr<CRYPTO_BUFFER> buf5;
  Message local_3c0;
  pointer local_3b8;
  pointer local_3b0;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_9;
  UniquePtr<CRYPTO_BUFFER> buf4;
  Message local_388;
  pointer local_380;
  pointer local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_8;
  Message local_358;
  size_t local_350;
  unsigned_long local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_7;
  Message local_328;
  uint8_t *local_320;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_2e8;
  Message local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__4;
  Message local_2c0;
  size_t local_2b8;
  uint local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_5;
  Message local_290;
  pointer local_288;
  pointer local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_4;
  Message local_260;
  Bytes local_258;
  Span<const_unsigned_char> local_248;
  Bytes local_238;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<CRYPTO_BUFFER> buf3;
  Message local_1c8;
  pointer local_1c0;
  pointer local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_2;
  Message local_198;
  Bytes local_190;
  Span<const_unsigned_char> local_180;
  Bytes local_170;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_130;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<CRYPTO_BUFFER> buf2;
  Message local_100;
  Bytes local_f8;
  Span<const_unsigned_char> local_e8;
  Bytes local_d8;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<CRYPTO_BUFFER> buf;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<CRYPTO_BUFFER_POOL> pool;
  PoolTest_Pooled_Test *this_local;
  
  __p = CRYPTO_BUFFER_POOL_new();
  std::unique_ptr<crypto_buffer_pool_st,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<crypto_buffer_pool_st,bssl::internal::Deleter> *)&gtest_ar_.message_,__p);
  testing::AssertionResult::
  AssertionResult<std::unique_ptr<crypto_buffer_pool_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
             (type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x8b85a7,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    pcVar3 = std::unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter> *)
                        &gtest_ar_.message_);
    pCVar4 = CRYPTO_BUFFER_new("\x01\x02\x03\x04",4,pcVar3);
    std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,pCVar4)
    ;
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
               (type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_88,(AssertionResult *)0x86b773,
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                 ,0x48,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      bssl::Span<unsigned_char_const>::Span<4ul>
                ((Span<unsigned_char_const> *)&local_e8,(uchar (*) [4])"\x01\x02\x03\x04");
      Bytes::Bytes(&local_d8,local_e8);
      pcVar5 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                          &gtest_ar__1.message_);
      puVar6 = CRYPTO_BUFFER_data(pcVar5);
      pcVar5 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                          &gtest_ar__1.message_);
      sVar7 = CRYPTO_BUFFER_len(pcVar5);
      Bytes::Bytes(&local_f8,puVar6,sVar7);
      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                ((EqHelper *)local_c8,"Bytes(kData1)",
                 "Bytes(CRYPTO_BUFFER_data(buf.get()), CRYPTO_BUFFER_len(buf.get()))",&local_d8,
                 &local_f8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&buf2,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                   ,0x4a,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&buf2,&local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf2);
        testing::Message::~Message(&local_100);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
      pcVar3 = std::unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter> *)
                          &gtest_ar_.message_);
      pCVar4 = CRYPTO_BUFFER_new("\x01\x02\x03\x04",4,pcVar3);
      std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&gtest_ar__2.message_,
                 pCVar4);
      testing::AssertionResult::
      AssertionResult<std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_120,
                 (unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,
                 (type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
      if (!bVar1) {
        testing::Message::Message(&local_128);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1.message_,(internal *)local_120,(AssertionResult *)"buf2",
                   "false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                   ,0x4e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_130,&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_128);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
      if (bVar1) {
        bssl::Span<unsigned_char_const>::Span<4ul>
                  ((Span<unsigned_char_const> *)&local_180,(uchar (*) [4])"\x01\x02\x03\x04");
        Bytes::Bytes(&local_170,local_180);
        pcVar5 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                            &gtest_ar__2.message_);
        puVar6 = CRYPTO_BUFFER_data(pcVar5);
        pcVar5 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                            &gtest_ar__2.message_);
        sVar7 = CRYPTO_BUFFER_len(pcVar5);
        Bytes::Bytes(&local_190,puVar6,sVar7);
        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                  ((EqHelper *)local_160,"Bytes(kData1)",
                   "Bytes(CRYPTO_BUFFER_data(buf2.get()), CRYPTO_BUFFER_len(buf2.get()))",&local_170
                   ,&local_190);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
        if (!bVar1) {
          testing::Message::Message(&local_198);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x50,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_2.message_,&local_198);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_198);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
        local_1b8 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                              ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                               &gtest_ar__1.message_);
        local_1c0 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                              ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                               &gtest_ar__2.message_);
        testing::internal::EqHelper::Compare<crypto_buffer_st_*,_crypto_buffer_st_*,_nullptr>
                  ((EqHelper *)local_1b0,"buf.get()","buf2.get()",&local_1b8,&local_1c0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
        if (!bVar1) {
          testing::Message::Message(&local_1c8);
          message = testing::Message::operator<<
                              (&local_1c8,(char (*) [39])"CRYPTO_BUFFER_POOL did not dedup data.");
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&buf3,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x52,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&buf3,message);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf3);
          testing::Message::~Message(&local_1c8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
        pcVar3 = std::unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter> *)
                            &gtest_ar_.message_);
        pCVar4 = CRYPTO_BUFFER_new("\x05\x06\a\b",4,pcVar3);
        std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   pCVar4);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_1e8,
                   (unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   (type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
        if (!bVar1) {
          testing::Message::Message(&local_1f0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_3.message_,(internal *)local_1e8,(AssertionResult *)"buf3",
                     "false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1f8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x58,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
          testing::internal::AssertHelper::~AssertHelper(&local_1f8);
          std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_1f0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
        if (bVar1) {
          bssl::Span<unsigned_char_const>::Span<4ul>
                    ((Span<unsigned_char_const> *)&local_248,(uchar (*) [4])"\x05\x06\a\b");
          Bytes::Bytes(&local_238,local_248);
          pcVar5 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                              &gtest_ar__3.message_);
          puVar6 = CRYPTO_BUFFER_data(pcVar5);
          pcVar5 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                              &gtest_ar__3.message_);
          sVar7 = CRYPTO_BUFFER_len(pcVar5);
          Bytes::Bytes(&local_258,puVar6,sVar7);
          testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                    ((EqHelper *)local_228,"Bytes(kData2)",
                     "Bytes(CRYPTO_BUFFER_data(buf3.get()), CRYPTO_BUFFER_len(buf3.get()))",
                     &local_238,&local_258);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
          if (!bVar1) {
            testing::Message::Message(&local_260);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                       ,0x5a,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_260);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_260);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
          local_280 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__1.message_);
          local_288 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__3.message_);
          testing::internal::CmpHelperNE<crypto_buffer_st*,crypto_buffer_st*>
                    ((internal *)local_278,"buf.get()","buf3.get()",&local_280,&local_288);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
          if (!bVar1) {
            testing::Message::Message(&local_290);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                       ,0x5b,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_290);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_290);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::operator=
                    ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                     (nullptr_t)0x0);
          local_2ac = 1;
          pcVar3 = std::unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter>::operator->
                             ((unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          local_2b8 = lh_CRYPTO_BUFFER_num_items(pcVar3->bufs);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                    ((EqHelper *)local_2a8,"1u","lh_CRYPTO_BUFFER_num_items(pool->bufs)",&local_2ac,
                     &local_2b8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
          if (!bVar1) {
            testing::Message::Message(&local_2c0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                       ,0x5f,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__4.message_,&local_2c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_2c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
          pcVar3 = std::unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          pCVar4 = CRYPTO_BUFFER_new_from_static_data_unsafe("\x05\x06\a\b",4,pcVar3);
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::reset
                    ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                     pCVar4);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_2d8,
                     (unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
          if (!bVar1) {
            testing::Message::Message(&local_2e0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_6.message_,(internal *)local_2d8,
                       (AssertionResult *)"buf3","false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_2e8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                       ,100,pcVar2);
            testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
            testing::internal::AssertHelper::~AssertHelper(&local_2e8);
            std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_2e0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
          if (bVar1) {
            pcVar5 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                &gtest_ar__3.message_);
            local_320 = CRYPTO_BUFFER_data(pcVar5);
            testing::internal::EqHelper::Compare<unsigned_char[4],_const_unsigned_char_*,_nullptr>
                      ((EqHelper *)local_318,"kData2","CRYPTO_BUFFER_data(buf3.get())",
                       (uchar (*) [4])"\x05\x06\a\b",&local_320);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
            if (!bVar1) {
              testing::Message::Message(&local_328);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                         ,0x65,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_7.message_,&local_328);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
              testing::Message::~Message(&local_328);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
            local_348 = 4;
            pcVar5 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                &gtest_ar__3.message_);
            local_350 = CRYPTO_BUFFER_len(pcVar5);
            testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                      ((EqHelper *)local_340,"sizeof(kData2)","CRYPTO_BUFFER_len(buf3.get())",
                       &local_348,&local_350);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
            if (!bVar1) {
              testing::Message::Message(&local_358);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                         ,0x66,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_8.message_,&local_358);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
              testing::Message::~Message(&local_358);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
            local_378 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                  ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__1.message_);
            local_380 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                  ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__3.message_);
            testing::internal::CmpHelperNE<crypto_buffer_st*,crypto_buffer_st*>
                      ((internal *)local_370,"buf.get()","buf3.get()",&local_378,&local_380);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
            if (!bVar1) {
              testing::Message::Message(&local_388);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&buf4,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                         ,0x67,pcVar2);
              testing::internal::AssertHelper::operator=((AssertHelper *)&buf4,&local_388);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf4);
              testing::Message::~Message(&local_388);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
            pcVar3 = std::unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            pCVar4 = CRYPTO_BUFFER_new("\x05\x06\a\b",4,pcVar3);
            std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&gtest_ar_9.message_,
                       pCVar4);
            local_3b0 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                  ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                   &gtest_ar_9.message_);
            local_3b8 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                  ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__3.message_);
            testing::internal::EqHelper::Compare<crypto_buffer_st_*,_crypto_buffer_st_*,_nullptr>
                      ((EqHelper *)local_3a8,"buf4.get()","buf3.get()",&local_3b0,&local_3b8);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
            if (!bVar1) {
              testing::Message::Message(&local_3c0);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&buf5,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                         ,0x6b,pcVar2);
              testing::internal::AssertHelper::operator=((AssertHelper *)&buf5,&local_3c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf5);
              testing::Message::~Message(&local_3c0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
            pcVar3 = std::unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            pCVar4 = CRYPTO_BUFFER_new_from_static_data_unsafe("\x05\x06\a\b",4,pcVar3);
            std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&gtest_ar_10.message_
                       ,pCVar4);
            local_3e8 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                  ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                   &gtest_ar_10.message_);
            local_3f0 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                  ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__3.message_);
            testing::internal::EqHelper::Compare<crypto_buffer_st_*,_crypto_buffer_st_*,_nullptr>
                      ((EqHelper *)local_3e0,"buf5.get()","buf3.get()",&local_3e8,&local_3f0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
            if (!bVar1) {
              testing::Message::Message(&local_3f8);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&buf6,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                         ,0x6f,pcVar2);
              testing::internal::AssertHelper::operator=((AssertHelper *)&buf6,&local_3f8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf6);
              testing::Message::~Message(&local_3f8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
            pcVar3 = std::unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            pCVar4 = CRYPTO_BUFFER_new_from_static_data_unsafe("\x01\x02\x03\x04",4,pcVar3);
            std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&gtest_ar__5.message_
                       ,pCVar4);
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_418,
                       (unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                       &gtest_ar__5.message_,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
            if (!bVar1) {
              testing::Message::Message(&local_420);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_11.message_,(internal *)local_418,
                         (AssertionResult *)"buf6","false","true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_428,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                         ,0x75,pcVar2);
              testing::internal::AssertHelper::operator=(&local_428,&local_420);
              testing::internal::AssertHelper::~AssertHelper(&local_428);
              std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
              testing::Message::~Message(&local_420);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
            if (bVar1) {
              pcVar5 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__5.message_);
              local_460 = CRYPTO_BUFFER_data(pcVar5);
              testing::internal::EqHelper::Compare<unsigned_char[4],_const_unsigned_char_*,_nullptr>
                        ((EqHelper *)local_458,"kData1","CRYPTO_BUFFER_data(buf6.get())",
                         (uchar (*) [4])"\x01\x02\x03\x04",&local_460);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
              if (!bVar1) {
                testing::Message::Message(&local_468);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                           ,0x76,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_12.message_,&local_468);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_12.message_);
                testing::Message::~Message(&local_468);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
              local_488 = 4;
              pcVar5 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__5.message_);
              local_490 = CRYPTO_BUFFER_len(pcVar5);
              testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                        ((EqHelper *)local_480,"sizeof(kData1)","CRYPTO_BUFFER_len(buf6.get())",
                         &local_488,&local_490);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
              if (!bVar1) {
                testing::Message::Message(&local_498);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                           ,0x77,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_13.message_,&local_498);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_13.message_);
                testing::Message::~Message(&local_498);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
              local_4b8 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__1.message_);
              local_4c0 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__5.message_);
              testing::internal::CmpHelperNE<crypto_buffer_st*,crypto_buffer_st*>
                        ((internal *)local_4b0,"buf.get()","buf6.get()",&local_4b8,&local_4c0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
              if (!bVar1) {
                testing::Message::Message(&local_4c8);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&buf7,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                           ,0x78,pcVar2);
                testing::internal::AssertHelper::operator=((AssertHelper *)&buf7,&local_4c8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf7);
                testing::Message::~Message(&local_4c8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
              pcVar3 = std::unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              pCVar4 = CRYPTO_BUFFER_new("\x01\x02\x03\x04",4,pcVar3);
              std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
              unique_ptr<bssl::internal::Deleter,void>
                        ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)
                         &gtest_ar_14.message_,pCVar4);
              local_4f0 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                     &gtest_ar_14.message_);
              local_4f8 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__5.message_);
              testing::internal::EqHelper::Compare<crypto_buffer_st_*,_crypto_buffer_st_*,_nullptr>
                        ((EqHelper *)local_4e8,"buf7.get()","buf6.get()",&local_4f0,&local_4f8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
              if (!bVar1) {
                testing::Message::Message(&local_500);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
                testing::internal::AssertHelper::AssertHelper
                          (&local_508,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                           ,0x7d,pcVar2);
                testing::internal::AssertHelper::operator=(&local_508,&local_500);
                testing::internal::AssertHelper::~AssertHelper(&local_508);
                testing::Message::~Message(&local_500);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
              std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                         &gtest_ar_14.message_);
            }
            std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                       &gtest_ar__5.message_);
            std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                       &gtest_ar_10.message_);
            std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&gtest_ar_9.message_
                      );
          }
        }
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      }
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(PoolTest, Pooled) {
  bssl::UniquePtr<CRYPTO_BUFFER_POOL> pool(CRYPTO_BUFFER_POOL_new());
  ASSERT_TRUE(pool);

  static const uint8_t kData1[4] = {1, 2, 3, 4};
  bssl::UniquePtr<CRYPTO_BUFFER> buf(
      CRYPTO_BUFFER_new(kData1, sizeof(kData1), pool.get()));
  ASSERT_TRUE(buf);
  EXPECT_EQ(Bytes(kData1),
            Bytes(CRYPTO_BUFFER_data(buf.get()), CRYPTO_BUFFER_len(buf.get())));

  bssl::UniquePtr<CRYPTO_BUFFER> buf2(
      CRYPTO_BUFFER_new(kData1, sizeof(kData1), pool.get()));
  ASSERT_TRUE(buf2);
  EXPECT_EQ(Bytes(kData1), Bytes(CRYPTO_BUFFER_data(buf2.get()),
                                 CRYPTO_BUFFER_len(buf2.get())));

  EXPECT_EQ(buf.get(), buf2.get()) << "CRYPTO_BUFFER_POOL did not dedup data.";

  // Different inputs do not get deduped.
  static const uint8_t kData2[4] = {5, 6, 7, 8};
  bssl::UniquePtr<CRYPTO_BUFFER> buf3(
      CRYPTO_BUFFER_new(kData2, sizeof(kData2), pool.get()));
  ASSERT_TRUE(buf3);
  EXPECT_EQ(Bytes(kData2), Bytes(CRYPTO_BUFFER_data(buf3.get()),
                                 CRYPTO_BUFFER_len(buf3.get())));
  EXPECT_NE(buf.get(), buf3.get());

  // When the last refcount on |buf3| is dropped, it is removed from the pool.
  buf3 = nullptr;
  EXPECT_EQ(1u, lh_CRYPTO_BUFFER_num_items(pool->bufs));

  // Static buffers participate in pooling.
  buf3.reset(CRYPTO_BUFFER_new_from_static_data_unsafe(kData2, sizeof(kData2),
                                                       pool.get()));
  ASSERT_TRUE(buf3);
  EXPECT_EQ(kData2, CRYPTO_BUFFER_data(buf3.get()));
  EXPECT_EQ(sizeof(kData2), CRYPTO_BUFFER_len(buf3.get()));
  EXPECT_NE(buf.get(), buf3.get());

  bssl::UniquePtr<CRYPTO_BUFFER> buf4(
      CRYPTO_BUFFER_new(kData2, sizeof(kData2), pool.get()));
  EXPECT_EQ(buf4.get(), buf3.get());

  bssl::UniquePtr<CRYPTO_BUFFER> buf5(CRYPTO_BUFFER_new_from_static_data_unsafe(
      kData2, sizeof(kData2), pool.get()));
  EXPECT_EQ(buf5.get(), buf3.get());

  // When creating a static buffer, if there is already a non-static buffer, it
  // replaces the old buffer.
  bssl::UniquePtr<CRYPTO_BUFFER> buf6(CRYPTO_BUFFER_new_from_static_data_unsafe(
      kData1, sizeof(kData1), pool.get()));
  ASSERT_TRUE(buf6);
  EXPECT_EQ(kData1, CRYPTO_BUFFER_data(buf6.get()));
  EXPECT_EQ(sizeof(kData1), CRYPTO_BUFFER_len(buf6.get()));
  EXPECT_NE(buf.get(), buf6.get());

  // Subsequent lookups of |kData1| should return |buf6|.
  bssl::UniquePtr<CRYPTO_BUFFER> buf7(
      CRYPTO_BUFFER_new(kData1, sizeof(kData1), pool.get()));
  EXPECT_EQ(buf7.get(), buf6.get());
}